

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool __thiscall EOPlus::Context::CheckRules(Context *this)

{
  State *pSVar1;
  _Elt_pointer pRVar2;
  int iVar3;
  runtime_error *this_00;
  _Elt_pointer pRVar4;
  _Elt_pointer pRVar5;
  _Map_pointer local_280;
  Rule rule;
  
  pSVar1 = this->state;
  if (pSVar1 == (State *)0x0) {
    if (this->finished == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"No state selected");
      goto LAB_0012c15c;
    }
  }
  else {
    if (100 < recursive_depth + 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Quest action recursion too deep");
LAB_0012c15c:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pRVar5 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pRVar4 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    local_280 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    pRVar2 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    recursive_depth = recursive_depth + 1;
    while (pRVar5 != pRVar2) {
      Rule::Rule(&rule,pRVar5);
      iVar3 = (*this->_vptr_Context[2])(this,&rule);
      if (((char)iVar3 != '\0') &&
         (iVar3 = (*this->_vptr_Context[1])(this,&rule.action), (char)iVar3 != '\0')) {
        recursive_depth = recursive_depth + -1;
        Rule::~Rule(&rule);
        return true;
      }
      Rule::~Rule(&rule);
      pRVar5 = pRVar5 + 1;
      if (pRVar5 == pRVar4) {
        pRVar5 = local_280[1];
        local_280 = local_280 + 1;
        pRVar4 = pRVar5 + 1;
      }
    }
    recursive_depth = recursive_depth + -1;
  }
  return false;
}

Assistant:

bool Context::CheckRules()
	{
		if (!this->state)
		{
			if (this->finished)
				return false;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			UTIL_FOREACH(this->state->rules, rule)
			{
				if (this->CheckRule(rule.expr))
				{
					if (this->DoAction(rule.action))
					{
						// *this may not be valid here
						--recursive_depth;
						return true;
					}
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;

		return false;
	}